

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O2

string * __thiscall
Assimp::Ogre::OgreXmlSerializer::CurrentNodeName_abi_cxx11_
          (string *__return_storage_ptr__,OgreXmlSerializer *this,bool forceRead)

{
  int iVar1;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  allocator local_39;
  string local_38 [32];
  
  if ((int)CONCAT71(in_register_00000011,forceRead) != 0) {
    iVar1 = (*this->m_reader->_vptr_IIrrXMLReader[0xd])();
    std::__cxx11::string::string(local_38,(char *)CONCAT44(extraout_var,iVar1),&local_39);
    std::__cxx11::string::operator=((string *)&this->m_currentNodeName,local_38);
    std::__cxx11::string::~string(local_38);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_currentNodeName);
  return __return_storage_ptr__;
}

Assistant:

std::string OgreXmlSerializer::CurrentNodeName(bool forceRead)
{
    if (forceRead)
        m_currentNodeName = std::string(m_reader->getNodeName());
    return m_currentNodeName;
}